

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

void duckdb_re2::FactorAlternationImpl::Round2
               (Regexp **sub,int nsub,ParseFlags flags,
               vector<duckdb_re2::Splice,_std::allocator<duckdb_re2::Splice>_> *splices)

{
  bool bVar1;
  RegexpOp RVar2;
  int iVar3;
  Regexp **ppRVar4;
  Regexp *__args_1;
  Regexp *pRVar5;
  int in_ESI;
  Regexp *in_RDI;
  int j;
  Regexp *prefix;
  Regexp *first_i;
  int i;
  Regexp *first;
  Regexp *in_stack_00000038;
  int start;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb8;
  Regexp *__args;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar6;
  Regexp *this;
  int local_1c;
  
  local_1c = 0;
  this = (Regexp *)0x0;
  iVar6 = 0;
  do {
    if (in_ESI < iVar6) {
      return;
    }
    __args = (Regexp *)0x0;
    if ((iVar6 < in_ESI) &&
       (__args = Regexp::LeadingRegexp
                           ((Regexp *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8))
       , this != (Regexp *)0x0)) {
      RVar2 = Regexp::op(this);
      if ((((RVar2 != kRegexpBeginLine) &&
           ((((RVar2 = Regexp::op(this), RVar2 != kRegexpEndLine &&
              (RVar2 = Regexp::op(this), RVar2 != kRegexpWordBoundary)) &&
             (RVar2 = Regexp::op(this), RVar2 != kRegexpNoWordBoundary)) &&
            ((RVar2 = Regexp::op(this), RVar2 != kRegexpBeginText &&
             (RVar2 = Regexp::op(this), RVar2 != kRegexpEndText)))))) &&
          (RVar2 = Regexp::op(this), RVar2 != kRegexpCharClass)) &&
         ((RVar2 = Regexp::op(this), RVar2 != kRegexpAnyChar &&
          (RVar2 = Regexp::op(this), RVar2 != kRegexpAnyByte)))) {
        RVar2 = Regexp::op(this);
        if (RVar2 == kRegexpRepeat) {
          in_stack_ffffffffffffffa8 = Regexp::min(this);
          iVar3 = Regexp::max(this);
          if (in_stack_ffffffffffffffa8 == iVar3) {
            ppRVar4 = Regexp::sub(this);
            RVar2 = Regexp::op(*ppRVar4);
            if (RVar2 != kRegexpLiteral) {
              ppRVar4 = Regexp::sub(this);
              RVar2 = Regexp::op(*ppRVar4);
              if (RVar2 != kRegexpCharClass) {
                ppRVar4 = Regexp::sub(this);
                RVar2 = Regexp::op(*ppRVar4);
                if (RVar2 != kRegexpAnyChar) {
                  ppRVar4 = Regexp::sub(this);
                  RVar2 = Regexp::op(*ppRVar4);
                  if (RVar2 != kRegexpAnyByte) goto LAB_0083d34e;
                }
              }
            }
            goto LAB_0083d332;
          }
        }
        goto LAB_0083d34e;
      }
LAB_0083d332:
      bVar1 = Regexp::Equal(in_stack_00000038,first);
      if (!bVar1) goto LAB_0083d34e;
    }
    else {
LAB_0083d34e:
      if ((iVar6 != local_1c) && (iVar6 != local_1c + 1)) {
        __args_1 = Regexp::Incref(in_RDI);
        for (iVar3 = local_1c; iVar3 < iVar6; iVar3 = iVar3 + 1) {
          pRVar5 = Regexp::RemoveLeadingRegexp(this);
          *(Regexp **)(&in_RDI->op_ + (long)iVar3 * 8) = pRVar5;
        }
        in_stack_ffffffffffffffac = iVar6 - local_1c;
        std::vector<duckdb_re2::Splice,std::allocator<duckdb_re2::Splice>>::
        emplace_back<duckdb_re2::Regexp*&,duckdb_re2::Regexp**,int>
                  ((vector<duckdb_re2::Splice,_std::allocator<duckdb_re2::Splice>_> *)
                   CONCAT44(iVar6,in_stack_ffffffffffffffd0),(Regexp **)__args,(Regexp ***)__args_1,
                   (int *)CONCAT44(iVar3,in_stack_ffffffffffffffb8));
      }
      if (iVar6 < in_ESI) {
        this = __args;
        local_1c = iVar6;
      }
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

void FactorAlternationImpl::Round2(Regexp** sub, int nsub,
                                   Regexp::ParseFlags flags,
                                   std::vector<Splice>* splices) {
  // Round 2: Factor out common simple prefixes,
  // just the first piece of each concatenation.
  // This will be good enough a lot of the time.
  //
  // Complex subexpressions (e.g. involving quantifiers)
  // are not safe to factor because that collapses their
  // distinct paths through the automaton, which affects
  // correctness in some cases.
  int start = 0;
  Regexp* first = NULL;
  for (int i = 0; i <= nsub; i++) {
    // Invariant: sub[start:i] consists of regexps that all
    // begin with first.
    Regexp* first_i = NULL;
    if (i < nsub) {
      first_i = Regexp::LeadingRegexp(sub[i]);
      if (first != NULL &&
          // first must be an empty-width op
          // OR a char class, any char or any byte
          // OR a fixed repeat of a literal, char class, any char or any byte.
          (first->op() == kRegexpBeginLine ||
           first->op() == kRegexpEndLine ||
           first->op() == kRegexpWordBoundary ||
           first->op() == kRegexpNoWordBoundary ||
           first->op() == kRegexpBeginText ||
           first->op() == kRegexpEndText ||
           first->op() == kRegexpCharClass ||
           first->op() == kRegexpAnyChar ||
           first->op() == kRegexpAnyByte ||
           (first->op() == kRegexpRepeat &&
            first->min() == first->max() &&
            (first->sub()[0]->op() == kRegexpLiteral ||
             first->sub()[0]->op() == kRegexpCharClass ||
             first->sub()[0]->op() == kRegexpAnyChar ||
             first->sub()[0]->op() == kRegexpAnyByte))) &&
          Regexp::Equal(first, first_i))
        continue;
    }

    // Found end of a run with common leading regexp:
    // sub[start:i] all begin with first,
    // but sub[i] does not.
    if (i == start) {
      // Nothing to do - first iteration.
    } else if (i == start+1) {
      // Just one: don't bother factoring.
    } else {
      Regexp* prefix = first->Incref();
      for (int j = start; j < i; j++)
        sub[j] = Regexp::RemoveLeadingRegexp(sub[j]);
      splices->emplace_back(prefix, sub + start, i - start);
    }

    // Prepare for next iteration (if there is one).
    if (i < nsub) {
      start = i;
      first = first_i;
    }
  }
}